

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall
GlobOpt::HasLiveObjectHeaderInlinedTypeSym
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  bool bVar1;
  SymID opndId_local;
  bool isObjTypeSpecialized_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  bVar1 = MapObjectHeaderInlinedTypeSymsUntil<GlobOpt::HasLiveObjectHeaderInlinedTypeSym(BasicBlock*,bool,unsigned_int)::__0>
                    (this,block,true,opndId,(anon_class_8_1_8991fb9c)this);
  return bVar1;
}

Assistant:

bool
GlobOpt::HasLiveObjectHeaderInlinedTypeSym(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    return this->MapObjectHeaderInlinedTypeSymsUntil(block, true, opndId, [&](SymID symId)->bool { return this->currentBlock->globOptData.liveFields->Test(symId); });
}